

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BufferPointerCase::test(BufferPointerCase *this)

{
  CallLogWrapper *this_00;
  void *expected;
  GLuint bufferId;
  StateQueryMemoryWriteGuard<void_*> mapPointerState;
  StateQueryMemoryWriteGuard<void_*> initialState;
  GLuint local_6c;
  StateQueryMemoryWriteGuard<void_*> local_68;
  StateQueryMemoryWriteGuard<void_*> local_48;
  
  local_6c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&local_6c);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,local_6c);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_48.m_postguard = (void *)0xdededededededede;
  local_48.m_preguard = (void *)0xdededededededede;
  local_48.m_value = (void *)0xdededededededede;
  glu::CallLogWrapper::glGetBufferPointerv(this_00,0x8892,0x88bd,&local_48.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            (&local_48,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  BufferParamVerifiers::checkPointerEquals
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             local_48.m_value,(void *)0x0);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,8,(void *)0x0,0x88ea);
  expected = glu::CallLogWrapper::glMapBufferRange(this_00,0x8892,0,8,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_68.m_postguard = (void *)0xdededededededede;
  local_68.m_preguard = (void *)0xdededededededede;
  local_68.m_value = (void *)0xdededededededede;
  glu::CallLogWrapper::glGetBufferPointerv(this_00,0x8892,0x88bd,&local_68.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            (&local_68,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  BufferParamVerifiers::checkPointerEquals
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             local_68.m_value,expected);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_6c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint bufferId = 0;
		glGenBuffers(1, &bufferId);
		glBindBuffer(GL_ARRAY_BUFFER, bufferId);
		expectError(GL_NO_ERROR);

		StateQueryMemoryWriteGuard<GLvoid*> initialState;
		glGetBufferPointerv(GL_ARRAY_BUFFER, GL_BUFFER_MAP_POINTER, &initialState);
		initialState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, initialState, 0);

		glBufferData(GL_ARRAY_BUFFER, 8, DE_NULL, GL_DYNAMIC_COPY);
		GLvoid* mapPointer = glMapBufferRange(GL_ARRAY_BUFFER, 0, 8, GL_MAP_READ_BIT);
		expectError(GL_NO_ERROR);

		StateQueryMemoryWriteGuard<GLvoid*> mapPointerState;
		glGetBufferPointerv(GL_ARRAY_BUFFER, GL_BUFFER_MAP_POINTER, &mapPointerState);
		mapPointerState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, mapPointerState, mapPointer);

		glDeleteBuffers(1, &bufferId);
		expectError(GL_NO_ERROR);
	}